

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O1

shared_ptr<cppnet::BlockMemoryPool> __thiscall
cppnet::MakeBlockMemoryPoolPtr(cppnet *this,uint32_t large_sz,uint32_t add_num)

{
  undefined8 *puVar1;
  shared_ptr<cppnet::BlockMemoryPool> sVar2;
  
  *(undefined8 *)this = 0;
  puVar1 = (undefined8 *)operator_new(0x38);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_001287a8;
  puVar1[2] = &PTR__BlockMemoryPool_00128748;
  *(uint32_t *)(puVar1 + 3) = add_num;
  *(uint32_t *)((long)puVar1 + 0x1c) = large_sz;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  *(undefined8 **)(this + 8) = puVar1;
  *(undefined8 **)this = puVar1 + 2;
  sVar2.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__BlockMemoryPool_00128748;
  sVar2.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppnet::BlockMemoryPool>)
         sVar2.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BlockMemoryPool> MakeBlockMemoryPoolPtr(uint32_t large_sz, uint32_t add_num) {
    return std::make_shared<BlockMemoryPool>(large_sz, add_num);
}